

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O1

shared_ptr<LToken> __thiscall LLexer::from_string(LLexer *this,string *token)

{
  undefined4 in_EAX;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<LToken> sVar2;
  undefined4 uStack_18;
  LNodeType local_14;
  
  uStack_18 = in_EAX;
  iVar1 = std::__cxx11::string::compare((char *)in_RDX);
  if (iVar1 == 0) {
    _uStack_18 = CONCAT44(4,uStack_18);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)in_RDX);
    if (iVar1 == 0) {
      _uStack_18 = CONCAT44(6,uStack_18);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)in_RDX);
      if (iVar1 == 0) {
        _uStack_18 = CONCAT44(7,uStack_18);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)in_RDX);
        if (iVar1 == 0) {
          _uStack_18 = CONCAT44(8,uStack_18);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)in_RDX);
          if (iVar1 == 0) {
            _uStack_18 = CONCAT44(0xd,uStack_18);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)in_RDX);
            if (iVar1 == 0) {
              _uStack_18 = CONCAT44(0xe,uStack_18);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)in_RDX);
              if (iVar1 == 0) {
                _uStack_18 = CONCAT44(0x11,uStack_18);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)in_RDX);
                if (iVar1 == 0) {
                  _uStack_18 = CONCAT44(0x12,uStack_18);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)in_RDX);
                  if (iVar1 == 0) {
                    _uStack_18 = CONCAT44(0x19,uStack_18);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)in_RDX);
                    if (iVar1 == 0) {
                      _uStack_18 = CONCAT44(0x1b,uStack_18);
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)in_RDX);
                      if (iVar1 == 0) {
                        _uStack_18 = CONCAT44(0x1c,uStack_18);
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)in_RDX);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)in_RDX);
                          if (iVar1 == 0) {
                            _uStack_18 = CONCAT44(0x1f,uStack_18);
                          }
                          else {
                            _uStack_18 = CONCAT44(0x1d,uStack_18);
                          }
                          this->_vptr_LLexer = (_func_int **)0x0;
                          goto LAB_00113688;
                        }
                        _uStack_18 = CONCAT44(0x1e,uStack_18);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->_vptr_LLexer = (_func_int **)0x0;
LAB_00113688:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<LToken,std::allocator<LToken>,LNodeType,std::__cxx11::string>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->prev_char,(LToken **)this,
             (allocator<LToken> *)((long)&uStack_18 + 3),&local_14,in_RDX);
  sVar2.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LToken>)sVar2.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LToken> LLexer::from_string(std::string token) {
    if (token == "break")
        return std::make_shared<LToken>(LNodeType::BREAK, std::move(token));
    if (token == "do")
        return std::make_shared<LToken>(LNodeType::DO, std::move(token));
    if (token == "else")
        return std::make_shared<LToken>(LNodeType::ELSE, std::move(token));
    if (token == "end")
        return std::make_shared<LToken>(LNodeType::END, std::move(token));
    if (token == "for")
        return std::make_shared<LToken>(LNodeType::FOR, std::move(token));
    if (token == "function")
        return std::make_shared<LToken>(LNodeType::FUNCTION, std::move(token));
    if (token == "if")
        return std::make_shared<LToken>(LNodeType::IF, std::move(token));
    if (token == "in")
        return std::make_shared<LToken>(LNodeType::IN, std::move(token));
    if (token == "return")
        return std::make_shared<LToken>(LNodeType::RETURN, std::move(token));
    if (token == "then")
        return std::make_shared<LToken>(LNodeType::THEN, std::move(token));
    if (token == "to")
        return std::make_shared<LToken>(LNodeType::TO, std::move(token));
    if (token == "while")
        return std::make_shared<LToken>(LNodeType::WHILE, std::move(token));
    if (token == "yield")
        return std::make_shared<LToken>(LNodeType::YIELD, std::move(token));
    return std::make_shared<LToken>(LNodeType::VAR, std::move(token));
}